

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

bool __thiscall
slang::IntervalMap<int,int,0u>::iterator::
overflow<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  NodeRef key;
  LeafNode<int,_int,_16U,_false> *pLVar5;
  NodeRef alloc_00;
  IndexPair IVar6;
  uint32_t *puVar7;
  uint uVar8;
  int in_ESI;
  undefined8 in_RDI;
  interval<int> ival;
  uint32_t pos;
  bool split;
  int delta_1;
  uint32_t m_1;
  uint32_t n_1;
  int delta;
  int m;
  uint32_t n;
  IndexPair newOffset;
  uint32_t newSizes [4];
  uint32_t newNode;
  NodeRef rightSib;
  NodeRef leftSib;
  uint32_t curSizes [4];
  LeafNode<int,_int,_16U,_false> *nodes [4];
  uint32_t numNodes;
  uint32_t numElems;
  uint32_t offset;
  Path *path;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  interval<int> in_stack_ffffffffffffff38;
  uint local_c0;
  uint32_t in_stack_ffffffffffffff44;
  byte bVar9;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  uint local_b0;
  int local_a8;
  uint local_a4;
  uint local_a0;
  uint32_t uStack_9c;
  uint32_t local_98;
  uint32_t in_stack_ffffffffffffff6c;
  iterator *in_stack_ffffffffffffff70;
  uint local_7c;
  uint32_t local_68;
  uint32_t in_stack_ffffffffffffff9c;
  iterator *in_stack_ffffffffffffffa0;
  NodeRef in_stack_ffffffffffffffa8;
  uint local_2c;
  uint32_t local_28;
  int local_c;
  
  IntervalMapDetails::Path::offset
            ((Path *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
  local_28 = 0;
  key = IntervalMapDetails::Path::getLeftSibling
                  ((Path *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  bVar2 = IntervalMapDetails::NodeRef::operator_cast_to_bool((NodeRef *)0x824714);
  if (bVar2) {
    local_28 = IntervalMapDetails::NodeRef::size((NodeRef *)0x824724);
    local_68 = local_28;
    in_stack_ffffffffffffffa8.pip.value =
         (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
         IntervalMapDetails::NodeRef::get<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                   ((NodeRef *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  local_2c = (uint)bVar2;
  uVar3 = IntervalMapDetails::Path::size
                    ((Path *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
  (&local_68)[local_2c] = uVar3;
  local_28 = uVar3 + local_28;
  pLVar5 = IntervalMapDetails::Path::node<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                     ((Path *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c);
  uVar8 = local_2c + 1;
  *(LeafNode<int,_int,_16U,_false> **)(&stack0xffffffffffffffa8 + (ulong)local_2c * 8) = pLVar5;
  alloc_00 = IntervalMapDetails::Path::getRightSibling
                       ((Path *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  bVar2 = IntervalMapDetails::NodeRef::operator_cast_to_bool((NodeRef *)0x8247f8);
  if (bVar2) {
    uVar3 = IntervalMapDetails::NodeRef::size((NodeRef *)0x824808);
    (&local_68)[uVar8] = uVar3;
    local_28 = uVar3 + local_28;
    pLVar5 = IntervalMapDetails::NodeRef::
             get<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                       ((NodeRef *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    *(LeafNode<int,_int,_16U,_false> **)(&stack0xffffffffffffffa8 + (ulong)uVar8 * 8) = pLVar5;
    uVar8 = local_2c + 2;
  }
  local_2c = uVar8;
  local_7c = 0;
  if (local_2c << 4 < local_28 + 1) {
    if (local_2c == 1) {
      local_7c = 1;
    }
    else {
      local_7c = local_2c - 1;
    }
    (&local_68)[local_2c] = (&local_68)[local_7c];
    *(undefined8 *)(&stack0xffffffffffffffa8 + (ulong)local_2c * 8) =
         *(undefined8 *)(&stack0xffffffffffffffa8 + (ulong)local_7c * 8);
    (&local_68)[local_7c] = 0;
    in_stack_ffffffffffffff24 = local_7c;
    pLVar5 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                       ((PoolAllocator<char,_192UL,_64UL> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    *(LeafNode<int,_int,_16U,_false> **)(&stack0xffffffffffffffa8 + (ulong)local_7c * 8) = pLVar5;
    local_2c = local_2c + 1;
  }
  IVar6 = IntervalMapDetails::distribute
                    (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                     (uint32_t *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  uVar8 = local_2c;
  do {
    do {
      uVar1 = uVar8;
      local_a4 = uVar1 - 1;
      if (local_a4 == 0) {
        local_b0 = 0;
        do {
          if (local_2c - 1 <= local_b0) {
            bVar2 = IntervalMapDetails::NodeRef::operator_cast_to_bool((NodeRef *)0x824b58);
            if (bVar2) {
              IntervalMapDetails::Path::moveLeft
                        ((Path *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
            }
            iVar4 = 0;
            local_c0 = 0;
            local_c = in_ESI;
            while( true ) {
              if ((local_7c == 0) || (local_c0 != local_7c)) {
                IntervalMapDetails::Path::setSize
                          ((Path *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
                IntervalMap<int,_int,_0U>::iterator::recomputeBounds
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
              }
              else {
                in_stack_ffffffffffffff38 =
                     IntervalMapDetails::
                     NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_>::
                     getBounds((NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_>
                                *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
                in_stack_ffffffffffffff20 = local_c;
                IntervalMapDetails::NodeRef::
                NodeRef<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                          ((NodeRef *)CONCAT44(in_stack_ffffffffffffff24,local_c),
                           (LeafNode<int,_int,_16U,_false> *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
                bVar2 = IntervalMap<int,_int,_0U>::iterator::insertNode
                                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                   in_stack_ffffffffffffffa8,(interval<int> *)key.pip.value,
                                   (allocator_type *)alloc_00.pip.value);
                iVar4 = (uint)bVar2 << 0x18;
                if (bVar2) {
                  local_c = local_c + 1;
                }
              }
              if (local_c0 + 1 == local_2c) break;
              IntervalMapDetails::Path::moveRight
                        ((Path *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
              local_c0 = local_c0 + 1;
            }
            while( true ) {
              bVar9 = (byte)((uint)iVar4 >> 0x18);
              local_a0 = IVar6.first;
              if (local_c0 == local_a0) break;
              IntervalMapDetails::Path::moveLeft
                        ((Path *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
              local_c0 = local_c0 - 1;
            }
            uStack_9c = IVar6.second;
            puVar7 = IntervalMapDetails::Path::offset
                               ((Path *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ),uStack_9c);
            *puVar7 = uStack_9c;
            return (bool)(bVar9 & 1);
          }
          uVar8 = local_b0;
          if ((&local_68)[local_b0] != (&local_98)[local_b0]) {
            do {
              uVar8 = uVar8 + 1;
              if (local_2c <= uVar8) break;
              in_stack_ffffffffffffff48 =
                   IntervalMapDetails::NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>
                   ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>
                                        *)CONCAT44(uVar8,in_stack_ffffffffffffff48),
                                       in_stack_ffffffffffffff44,
                                       (NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>
                                        *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                       in_stack_ffffffffffffff30);
              (&local_68)[uVar8] = (&local_68)[uVar8] + in_stack_ffffffffffffff48;
              (&local_68)[local_b0] = (&local_68)[local_b0] - in_stack_ffffffffffffff48;
            } while ((&local_68)[local_b0] < (&local_98)[local_b0]);
          }
          local_b0 = local_b0 + 1;
        } while( true );
      }
      uVar8 = local_a4;
    } while ((&local_68)[local_a4] == (&local_98)[local_a4]);
    for (local_a8 = uVar1 - 2; uVar8 = local_a4, local_a8 != -1; local_a8 = local_a8 + -1) {
      iVar4 = IntervalMapDetails::NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>::
              adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                in_stack_ffffffffffffff44,
                                (NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *)
                                in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                in_stack_ffffffffffffff30);
      (&local_68)[local_a8] = (&local_68)[local_a8] - iVar4;
      (&local_68)[local_a4] = (&local_68)[local_a4] + iVar4;
      uVar8 = local_a4;
      if ((&local_98)[local_a4] <= (&local_68)[local_a4]) break;
    }
  } while( true );
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}